

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O0

vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *
ColorTracker::getMaxAreaContour
          (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__return_storage_ptr__,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *contours)

{
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *this;
  bool bVar1;
  ProcessingException *this_00;
  reference __x;
  iterator iVar2;
  iterator __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  size_type __n;
  const_reference __x_00;
  difference_type maxIndex;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> maxIter;
  value_type_conflict1 local_1c8;
  undefined1 local_1c0 [8];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> contour;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *__range1;
  vector<double,_std::allocator<double>_> area;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_18;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *contours_local;
  
  local_18 = contours;
  contours_local =
       (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        *)__return_storage_ptr__;
  bVar1 = std::
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ::empty(contours);
  if (!bVar1) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&__range1);
    this = local_18;
    __end1 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::begin(local_18);
    contour.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ::end(this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                                  *)&contour.
                                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      __x = __gnu_cxx::
            __normal_iterator<const_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
            ::operator*(&__end1);
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_1c0,__x);
      cv::_InputArray::_InputArray<cv::Point_<int>>
                ((_InputArray *)&maxIter,
                 (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_1c0);
      local_1c8 = (value_type_conflict1)cv::contourArea((_InputArray *)&maxIter,false);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&__range1,&local_1c8);
      cv::_InputArray::~_InputArray((_InputArray *)&maxIter);
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_1c0);
      __gnu_cxx::
      __normal_iterator<const_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
      ::operator++(&__end1);
    }
    iVar2 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)&__range1);
    __last = std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)&__range1);
    __last_00 = std::
                max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                          (iVar2._M_current,__last._M_current);
    iVar2 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)&__range1);
    __n = std::
          distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar2._M_current,__last_00);
    __x_00 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::at(local_18,__n);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
              (__return_storage_ptr__,__x_00);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&__range1);
    return __return_storage_ptr__;
  }
  area.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  this_00 = (ProcessingException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,&local_119);
  std::operator+(&local_f8,"in ",&local_118);
  std::operator+(&local_d8,&local_f8,", at Line ");
  std::__cxx11::to_string(&local_150,0x110);
  std::operator+(&local_b8,&local_d8,&local_150);
  std::operator+(&local_98,&local_b8,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_170,"getMaxAreaContour",
             (allocator *)
             ((long)&area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::operator+(&local_78,&local_98,&local_170);
  std::operator+(&local_58,&local_78,"(): ");
  std::operator+(&local_38,&local_58,"invalid input: given contours list length is 0");
  ProcessingException::ProcessingException(this_00,&local_38);
  area.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 0;
  __cxa_throw(this_00,&ProcessingException::typeinfo,ProcessingException::~ProcessingException);
}

Assistant:

vector<Point> ColorTracker::getMaxAreaContour(const vector<vector<Point>>& contours) noexcept(false){
    if(contours.empty()){
        //cout << "given contours list length is 0" << endl;
        throw ProcessingException(WHERE + "invalid input: given contours list length is 0");
    }
    
    vector<double> area;
    for(vector<Point> contour : contours){
        area.push_back(cv::contourArea(contour));
    }

    auto maxIter = std::max_element(area.begin(),area.end());
    auto maxIndex = std::distance(area.begin(),maxIter);

    return contours.at(maxIndex);
}